

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

void embree::avx::DiscMiIntersector1<8,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *Disc)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Geometry *pGVar5;
  long lVar6;
  __int_type_conflict _Var7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  float fVar23;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  float fVar33;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar34 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  float fVar53;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar63 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar64 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  DiscIntersectorHitM<8> hit;
  int local_1f0;
  float local_1ec;
  Scene *local_1e8;
  float local_1e0;
  float local_1dc;
  float local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  uint local_1cc;
  uint local_1c8;
  uint local_1c4;
  uint local_1c0;
  RTCFilterFunctionNArguments local_1b0;
  undefined1 local_180 [32];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  float local_e0 [4];
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0 [4];
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0 [4];
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  undefined1 auVar43 [64];
  
  local_1e8 = context->scene;
  pGVar5 = (local_1e8->geometries).items[Disc->sharedGeomID].ptr;
  lVar6 = *(long *)&pGVar5->field_0x58;
  _Var7 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar18._16_16_ = *(undefined1 (*) [16])(lVar6 + (Disc->primIDs).field_0.i[4] * _Var7);
  auVar18._0_16_ = *(undefined1 (*) [16])(lVar6 + (Disc->primIDs).field_0.i[0] * _Var7);
  auVar20._16_16_ = *(undefined1 (*) [16])(lVar6 + (Disc->primIDs).field_0.i[5] * _Var7);
  auVar20._0_16_ = *(undefined1 (*) [16])(lVar6 + (Disc->primIDs).field_0.i[1] * _Var7);
  auVar24._16_16_ = *(undefined1 (*) [16])(lVar6 + (Disc->primIDs).field_0.i[6] * _Var7);
  auVar24._0_16_ = *(undefined1 (*) [16])(lVar6 + (Disc->primIDs).field_0.i[2] * _Var7);
  auVar34._16_16_ = *(undefined1 (*) [16])(lVar6 + (Disc->primIDs).field_0.i[7] * _Var7);
  auVar34._0_16_ = *(undefined1 (*) [16])(lVar6 + (Disc->primIDs).field_0.i[3] * _Var7);
  auVar22 = vunpcklps_avx(auVar18,auVar24);
  auVar24 = vunpckhps_avx(auVar18,auVar24);
  auVar9 = vunpcklps_avx(auVar20,auVar34);
  auVar34 = vunpckhps_avx(auVar20,auVar34);
  auVar18 = vunpcklps_avx(auVar22,auVar9);
  auVar22 = vunpckhps_avx(auVar22,auVar9);
  auVar9 = vunpcklps_avx(auVar24,auVar34);
  local_150 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  local_160 = local_150;
  uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  auVar25._16_4_ = uVar1;
  auVar25._20_4_ = uVar1;
  auVar25._24_4_ = uVar1;
  auVar25._28_4_ = uVar1;
  auVar18 = vsubps_avx(auVar18,auVar25);
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar21._4_4_ = uVar1;
  auVar21._0_4_ = uVar1;
  auVar21._8_4_ = uVar1;
  auVar21._12_4_ = uVar1;
  auVar21._16_4_ = uVar1;
  auVar21._20_4_ = uVar1;
  auVar21._24_4_ = uVar1;
  auVar21._28_4_ = uVar1;
  auVar20 = vsubps_avx(auVar22,auVar21);
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  auVar22._16_4_ = uVar1;
  auVar22._20_4_ = uVar1;
  auVar22._24_4_ = uVar1;
  auVar22._28_4_ = uVar1;
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar21 = vsubps_avx(auVar9,auVar22);
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar4 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar53 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar23 = (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar41 = ZEXT416((uint)(fVar53 * fVar53 + fVar23 * fVar23 + fVar4 * fVar4));
  auVar41 = vshufps_avx(auVar41,auVar41,0);
  auVar51._16_16_ = auVar41;
  auVar51._0_16_ = auVar41;
  auVar22 = vrcpps_avx(auVar51);
  fVar4 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar63._8_4_ = 0x3f800000;
  auVar63._0_8_ = 0x3f8000003f800000;
  auVar63._12_4_ = 0x3f800000;
  auVar63._16_4_ = 0x3f800000;
  auVar63._20_4_ = 0x3f800000;
  auVar63._24_4_ = 0x3f800000;
  auVar63._28_4_ = 0x3f800000;
  fVar53 = auVar22._0_4_;
  fVar57 = auVar22._4_4_;
  auVar9._4_4_ = fVar57 * auVar41._4_4_;
  auVar9._0_4_ = fVar53 * auVar41._0_4_;
  fVar58 = auVar22._8_4_;
  auVar9._8_4_ = fVar58 * auVar41._8_4_;
  fVar59 = auVar22._12_4_;
  auVar9._12_4_ = fVar59 * auVar41._12_4_;
  fVar60 = auVar22._16_4_;
  auVar9._16_4_ = fVar60 * auVar41._0_4_;
  fVar61 = auVar22._20_4_;
  auVar9._20_4_ = fVar61 * auVar41._4_4_;
  fVar62 = auVar22._24_4_;
  auVar9._24_4_ = fVar62 * auVar41._8_4_;
  auVar9._28_4_ = auVar41._12_4_;
  auVar22 = vsubps_avx(auVar63,auVar9);
  fVar44 = auVar21._0_4_;
  fVar45 = auVar21._4_4_;
  fVar46 = auVar21._8_4_;
  fVar47 = auVar21._12_4_;
  fVar48 = auVar21._16_4_;
  fVar49 = auVar21._20_4_;
  fVar50 = auVar21._24_4_;
  fVar33 = auVar20._0_4_;
  fVar35 = auVar20._4_4_;
  fVar36 = auVar20._8_4_;
  fVar37 = auVar20._12_4_;
  fVar38 = auVar20._16_4_;
  fVar39 = auVar20._20_4_;
  fVar40 = auVar20._24_4_;
  fVar23 = auVar18._0_4_;
  fVar27 = auVar18._4_4_;
  fVar28 = auVar18._8_4_;
  fVar29 = auVar18._12_4_;
  fVar30 = auVar18._16_4_;
  fVar31 = auVar18._20_4_;
  fVar32 = auVar18._24_4_;
  auVar43._0_4_ =
       (fVar23 * fVar2 + fVar33 * fVar3 + fVar44 * fVar4) * (fVar53 + fVar53 * auVar22._0_4_);
  auVar43._4_4_ =
       (fVar27 * fVar2 + fVar35 * fVar3 + fVar45 * fVar4) * (fVar57 + fVar57 * auVar22._4_4_);
  auVar43._8_4_ =
       (fVar28 * fVar2 + fVar36 * fVar3 + fVar46 * fVar4) * (fVar58 + fVar58 * auVar22._8_4_);
  auVar43._12_4_ =
       (fVar29 * fVar2 + fVar37 * fVar3 + fVar47 * fVar4) * (fVar59 + fVar59 * auVar22._12_4_);
  auVar43._16_4_ =
       (fVar30 * fVar2 + fVar38 * fVar3 + fVar48 * fVar4) * (fVar60 + fVar60 * auVar22._16_4_);
  auVar43._20_4_ =
       (fVar31 * fVar2 + fVar39 * fVar3 + fVar49 * fVar4) * (fVar61 + fVar61 * auVar22._20_4_);
  auVar43._28_36_ = in_ZMM11._28_36_;
  auVar43._24_4_ =
       (fVar32 * fVar2 + fVar40 * fVar3 + fVar50 * fVar4) * (fVar62 + fVar62 * auVar22._24_4_);
  local_100 = auVar43._0_32_;
  auVar64 = ZEXT3264(local_100);
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  auVar52._16_4_ = uVar1;
  auVar52._20_4_ = uVar1;
  auVar52._24_4_ = uVar1;
  auVar52._28_4_ = uVar1;
  auVar22 = vcmpps_avx(auVar52,local_100,2);
  fVar53 = (ray->super_RayK<1>).tfar;
  auVar54._4_4_ = fVar53;
  auVar54._0_4_ = fVar53;
  auVar54._8_4_ = fVar53;
  auVar54._12_4_ = fVar53;
  auVar54._16_4_ = fVar53;
  auVar54._20_4_ = fVar53;
  auVar54._24_4_ = fVar53;
  auVar54._28_4_ = fVar53;
  auVar9 = vcmpps_avx(local_100,auVar54,2);
  auVar22 = vandps_avx(auVar22,auVar9);
  auVar41 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar55._16_16_ = auVar41;
  auVar55._0_16_ = auVar41;
  auVar9 = vcvtdq2ps_avx(auVar55);
  auVar9 = vcmpps_avx(_DAT_01faff40,auVar9,1);
  auVar25 = auVar9 & auVar22;
  if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0x7f,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar25 >> 0xbf,0) != '\0') ||
      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0') {
    auVar22 = vandps_avx(auVar22,auVar9);
    auVar25 = vunpckhps_avx(auVar24,auVar34);
    auVar10._4_4_ = auVar43._4_4_ * fVar2;
    auVar10._0_4_ = auVar43._0_4_ * fVar2;
    auVar10._8_4_ = auVar43._8_4_ * fVar2;
    auVar10._12_4_ = auVar43._12_4_ * fVar2;
    auVar10._16_4_ = auVar43._16_4_ * fVar2;
    auVar10._20_4_ = auVar43._20_4_ * fVar2;
    auVar10._24_4_ = auVar43._24_4_ * fVar2;
    auVar10._28_4_ = auVar34._28_4_;
    auVar11._4_4_ = auVar43._4_4_ * fVar3;
    auVar11._0_4_ = auVar43._0_4_ * fVar3;
    auVar11._8_4_ = auVar43._8_4_ * fVar3;
    auVar11._12_4_ = auVar43._12_4_ * fVar3;
    auVar11._16_4_ = auVar43._16_4_ * fVar3;
    auVar11._20_4_ = auVar43._20_4_ * fVar3;
    auVar11._24_4_ = auVar43._24_4_ * fVar3;
    auVar11._28_4_ = auVar9._28_4_;
    auVar13._4_4_ = auVar43._4_4_ * fVar4;
    auVar13._0_4_ = auVar43._0_4_ * fVar4;
    auVar13._8_4_ = auVar43._8_4_ * fVar4;
    auVar13._12_4_ = auVar43._12_4_ * fVar4;
    auVar13._16_4_ = auVar43._16_4_ * fVar4;
    auVar13._20_4_ = auVar43._20_4_ * fVar4;
    auVar13._24_4_ = auVar43._24_4_ * fVar4;
    auVar13._28_4_ = DAT_01faff40._28_4_;
    auVar9 = vsubps_avx(auVar18,auVar10);
    auVar24 = vsubps_avx(auVar20,auVar11);
    auVar34 = vsubps_avx(auVar21,auVar13);
    auVar56._0_4_ =
         auVar24._0_4_ * auVar24._0_4_ + auVar34._0_4_ * auVar34._0_4_ + auVar9._0_4_ * auVar9._0_4_
    ;
    auVar56._4_4_ =
         auVar24._4_4_ * auVar24._4_4_ + auVar34._4_4_ * auVar34._4_4_ + auVar9._4_4_ * auVar9._4_4_
    ;
    auVar56._8_4_ =
         auVar24._8_4_ * auVar24._8_4_ + auVar34._8_4_ * auVar34._8_4_ + auVar9._8_4_ * auVar9._8_4_
    ;
    auVar56._12_4_ =
         auVar24._12_4_ * auVar24._12_4_ + auVar34._12_4_ * auVar34._12_4_ +
         auVar9._12_4_ * auVar9._12_4_;
    auVar56._16_4_ =
         auVar24._16_4_ * auVar24._16_4_ + auVar34._16_4_ * auVar34._16_4_ +
         auVar9._16_4_ * auVar9._16_4_;
    auVar56._20_4_ =
         auVar24._20_4_ * auVar24._20_4_ + auVar34._20_4_ * auVar34._20_4_ +
         auVar9._20_4_ * auVar9._20_4_;
    auVar56._24_4_ =
         auVar24._24_4_ * auVar24._24_4_ + auVar34._24_4_ * auVar34._24_4_ +
         auVar9._24_4_ * auVar9._24_4_;
    auVar56._28_4_ = auVar24._28_4_ + auVar34._28_4_ + auVar9._28_4_;
    auVar12._4_4_ = auVar25._4_4_ * auVar25._4_4_;
    auVar12._0_4_ = auVar25._0_4_ * auVar25._0_4_;
    auVar12._8_4_ = auVar25._8_4_ * auVar25._8_4_;
    auVar12._12_4_ = auVar25._12_4_ * auVar25._12_4_;
    auVar12._16_4_ = auVar25._16_4_ * auVar25._16_4_;
    auVar12._20_4_ = auVar25._20_4_ * auVar25._20_4_;
    auVar12._24_4_ = auVar25._24_4_ * auVar25._24_4_;
    auVar12._28_4_ = auVar9._28_4_;
    auVar9 = vcmpps_avx(auVar56,auVar12,2);
    auVar24 = auVar22 & auVar9;
    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0x7f,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0xbf,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0')
    {
      auVar22 = vandps_avx(auVar22,auVar9);
      auVar26._0_4_ = fVar23 * fVar23 + fVar33 * fVar33 + fVar44 * fVar44;
      auVar26._4_4_ = fVar27 * fVar27 + fVar35 * fVar35 + fVar45 * fVar45;
      auVar26._8_4_ = fVar28 * fVar28 + fVar36 * fVar36 + fVar46 * fVar46;
      auVar26._12_4_ = fVar29 * fVar29 + fVar37 * fVar37 + fVar47 * fVar47;
      auVar26._16_4_ = fVar30 * fVar30 + fVar38 * fVar38 + fVar48 * fVar48;
      auVar26._20_4_ = fVar31 * fVar31 + fVar39 * fVar39 + fVar49 * fVar49;
      auVar26._24_4_ = fVar32 * fVar32 + fVar40 * fVar40 + fVar50 * fVar50;
      auVar26._28_4_ = auVar18._28_4_ + auVar20._28_4_ + auVar21._28_4_;
      auVar9 = vcmpps_avx(auVar26,auVar12,6);
      auVar18 = auVar22 & auVar9;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        uVar14 = (ray->super_RayK<1>).mask;
        auVar22 = vandps_avx(auVar9,auVar22);
        local_1ec = (ray->super_RayK<1>).tfar;
        local_120 = ZEXT432(0) << 0x20;
        local_140 = ZEXT432(0) << 0x20;
        local_e0[0] = -fVar2;
        local_e0[1] = -fVar2;
        local_e0[2] = -fVar2;
        local_e0[3] = -fVar2;
        fStack_d0 = -fVar2;
        fStack_cc = -fVar2;
        fStack_c8 = -fVar2;
        fStack_c4 = -fVar2;
        local_c0[0] = -fVar3;
        local_c0[1] = -fVar3;
        local_c0[2] = -fVar3;
        local_c0[3] = -fVar3;
        fStack_b0 = -fVar3;
        fStack_ac = -fVar3;
        fStack_a8 = -fVar3;
        fStack_a4 = -fVar3;
        local_a0[0] = -fVar4;
        local_a0[1] = -fVar4;
        local_a0[2] = -fVar4;
        local_a0[3] = -fVar4;
        fStack_90 = -fVar4;
        fStack_8c = -fVar4;
        fStack_88 = -fVar4;
        fStack_84 = -fVar4;
        local_180 = auVar22;
        auVar42._8_4_ = 0x7f800000;
        auVar42._0_8_ = 0x7f8000007f800000;
        auVar42._12_4_ = 0x7f800000;
        auVar42._16_4_ = 0x7f800000;
        auVar42._20_4_ = 0x7f800000;
        auVar42._24_4_ = 0x7f800000;
        auVar42._28_4_ = 0x7f800000;
        auVar43 = ZEXT3264(auVar42);
        auVar9 = vblendvps_avx(auVar42,local_100,auVar22);
        auVar18 = vshufps_avx(auVar9,auVar9,0xb1);
        auVar18 = vminps_avx(auVar9,auVar18);
        auVar20 = vshufpd_avx(auVar18,auVar18,5);
        auVar18 = vminps_avx(auVar18,auVar20);
        auVar20 = vperm2f128_avx(auVar18,auVar18,1);
        auVar18 = vminps_avx(auVar18,auVar20);
        auVar9 = vcmpps_avx(auVar9,auVar18,0);
        auVar18 = auVar22 & auVar9;
        if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar18 >> 0x7f,0) != '\0') ||
              (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0xbf,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar18[0x1f] < '\0') {
          auVar22 = vandps_avx(auVar9,auVar22);
        }
        uVar15 = vmovmskps_avx(auVar22);
        uVar16 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
          }
        }
        do {
          uVar17 = (ulong)uVar16;
          local_1c8 = *(uint *)(local_160 + uVar17 * 4);
          pGVar5 = (local_1e8->geometries).items[local_1c8].ptr;
          if ((pGVar5->mask & uVar14) == 0) {
            *(undefined4 *)(local_180 + uVar17 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar2 = *(float *)(local_140 + uVar17 * 4);
              fVar3 = *(float *)(local_120 + uVar17 * 4);
              (ray->super_RayK<1>).tfar = local_e0[uVar17 - 8];
              (ray->Ng).field_0.field_0.x = local_e0[uVar17];
              (ray->Ng).field_0.field_0.y = local_c0[uVar17];
              (ray->Ng).field_0.field_0.z = local_a0[uVar17];
              ray->u = fVar2;
              ray->v = fVar3;
              ray->primID = (Disc->primIDs).field_0.i[uVar17];
              ray->geomID = local_1c8;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              return;
            }
            local_80 = auVar64._0_32_;
            local_1e0 = local_e0[uVar17];
            local_1dc = local_c0[uVar17];
            local_1d8 = local_a0[uVar17];
            local_1d4 = *(undefined4 *)(local_140 + uVar17 * 4);
            local_1d0 = *(undefined4 *)(local_120 + uVar17 * 4);
            local_1cc = (Disc->primIDs).field_0.i[uVar17];
            local_1c4 = context->user->instID[0];
            local_1c0 = context->user->instPrimID[0];
            (ray->super_RayK<1>).tfar = local_e0[uVar17 - 8];
            local_1f0 = -1;
            local_1b0.valid = &local_1f0;
            local_1b0.geometryUserPtr = pGVar5->userPtr;
            local_1b0.context = context->user;
            local_1b0.ray = (RTCRayN *)ray;
            local_1b0.hit = (RTCHitN *)&local_1e0;
            local_1b0.N = 1;
            if ((pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
               ((*pGVar5->intersectionFilterN)(&local_1b0), *local_1b0.valid != 0)) {
              p_Var8 = context->args->filter;
              if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                 ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                    RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)) &&
                  ((*p_Var8)(&local_1b0), *local_1b0.valid == 0)))) goto LAB_00fc502b;
              (((Vec3f *)((long)local_1b0.ray + 0x30))->field_0).field_0.x = *(float *)local_1b0.hit
              ;
              (((Vec3f *)((long)local_1b0.ray + 0x30))->field_0).field_0.y =
                   *(float *)(local_1b0.hit + 4);
              (((Vec3f *)((long)local_1b0.ray + 0x30))->field_0).field_0.z =
                   *(float *)(local_1b0.hit + 8);
              *(float *)((long)local_1b0.ray + 0x3c) = *(float *)(local_1b0.hit + 0xc);
              *(float *)((long)local_1b0.ray + 0x40) = *(float *)(local_1b0.hit + 0x10);
              *(float *)((long)local_1b0.ray + 0x44) = *(float *)(local_1b0.hit + 0x14);
              *(float *)((long)local_1b0.ray + 0x48) = *(float *)(local_1b0.hit + 0x18);
              *(float *)((long)local_1b0.ray + 0x4c) = *(float *)(local_1b0.hit + 0x1c);
              *(float *)((long)local_1b0.ray + 0x50) = *(float *)(local_1b0.hit + 0x20);
            }
            else {
LAB_00fc502b:
              (ray->super_RayK<1>).tfar = local_1ec;
            }
            auVar43 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            *(undefined4 *)(local_180 + uVar17 * 4) = 0;
            fVar2 = (ray->super_RayK<1>).tfar;
            auVar19._4_4_ = fVar2;
            auVar19._0_4_ = fVar2;
            auVar19._8_4_ = fVar2;
            auVar19._12_4_ = fVar2;
            auVar19._16_4_ = fVar2;
            auVar19._20_4_ = fVar2;
            auVar19._24_4_ = fVar2;
            auVar19._28_4_ = fVar2;
            auVar64 = ZEXT3264(local_80);
            auVar22 = vcmpps_avx(local_80,auVar19,2);
            local_180 = vandps_avx(auVar22,local_180);
            uVar14 = (ray->super_RayK<1>).mask;
            local_1ec = (ray->super_RayK<1>).tfar;
          }
          if ((((((((local_180 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_180 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_180 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_180 >> 0x7f,0) == '\0') &&
                (local_180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_180 >> 0xbf,0) == '\0') &&
              (local_180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_180[0x1f]) {
            return;
          }
          auVar22 = vblendvps_avx(auVar43._0_32_,auVar64._0_32_,local_180);
          auVar9 = vshufps_avx(auVar22,auVar22,0xb1);
          auVar9 = vminps_avx(auVar22,auVar9);
          auVar18 = vshufpd_avx(auVar9,auVar9,5);
          auVar9 = vminps_avx(auVar9,auVar18);
          auVar18 = vperm2f128_avx(auVar9,auVar9,1);
          auVar9 = vminps_avx(auVar9,auVar18);
          auVar9 = vcmpps_avx(auVar22,auVar9,0);
          auVar18 = local_180 & auVar9;
          auVar22 = local_180;
          if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar18 >> 0x7f,0) != '\0') ||
                (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar18 >> 0xbf,0) != '\0') ||
              (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar18[0x1f] < '\0') {
            auVar22 = vandps_avx(auVar9,local_180);
          }
          uVar15 = vmovmskps_avx(auVar22);
          uVar16 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Intersect1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }